

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

string * __thiscall
IntegerInstance::op_subtract
          (IntegerInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  undefined8 *puVar4;
  char *pcVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  long in_RSI;
  string *in_RDI;
  string *in_stack_00000008;
  double local_50;
  string *str;
  allocator local_19;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  
  str = in_RDI;
  local_18 = in_RDX;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  if (sVar3 != 1) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar4,&char_const*::typeinfo,0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,0);
  bVar1 = Grammar::is_integer_value(str);
  if (!bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_18,0);
    bVar1 = Grammar::is_float_value(in_stack_00000008);
    if (!bVar1) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = "RuntimeError: invalid argument.";
      __cxa_throw(puVar4,&char_const*::typeinfo,0);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,0);
  bVar1 = Grammar::is_integer_value(str);
  if (bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_18,0);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    iVar2 = atoi(pcVar5);
    local_50 = (double)iVar2;
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_18,0);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    local_50 = atof(pcVar5);
  }
  *(int *)(in_RSI + 0x58) = (int)((double)*(int *)(in_RSI + 0x58) - local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)str,"null",&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  return in_RDI;
}

Assistant:

std::string IntegerInstance::op_subtract(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    if (!Grammar::is_integer_value(arguments[0]) && !Grammar::is_float_value(arguments[0]))
        throw EXC_INVALID_ARGUMENT;
    _value -= (Grammar::is_integer_value(arguments[0])) ? atoi(arguments[0].c_str()) : atof(arguments[0].c_str());
    return "null";
}